

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

bool absl::str_format_internal::
     ParseFormatString<absl::str_format_internal::ParsedFormatBase::ParsedFormatConsumer>
               (string_view src,ParsedFormatConsumer consumer)

{
  byte *p;
  bool bVar1;
  void *pvVar2;
  byte *end;
  byte *__s;
  bool bVar3;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  ConvTag tag;
  int next_arg;
  UnboundConversion conv;
  ParsedFormatConsumer consumer_local;
  
  __s = (byte *)src._M_str;
  consumer_local.data_pos = consumer.data_pos;
  consumer_local.parsed = consumer.parsed;
  next_arg = 0;
  end = __s + src._M_len;
  do {
    while( true ) {
      bVar3 = __s == end;
      if (bVar3) {
        return bVar3;
      }
      pvVar2 = memchr(__s,0x25,(long)end - (long)__s);
      if (pvVar2 == (void *)0x0) {
        s_03._M_str = (char *)__s;
        s_03._M_len = (long)end - (long)__s;
        bVar3 = ParsedFormatBase::ParsedFormatConsumer::Append(&consumer_local,s_03);
        return bVar3;
      }
      s_01._M_len = (long)pvVar2 - (long)__s;
      s_01._M_str = (char *)__s;
      bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append(&consumer_local,s_01);
      if (!bVar1) {
        return bVar3;
      }
      p = (byte *)((long)pvVar2 + 1);
      if (end <= p) {
        return bVar3;
      }
      tag.tag_ = ConvTagHolder::value[*p].tag_;
      if ((char)tag.tag_ < '\0') break;
      if (next_arg < 0) {
        return false;
      }
      conv.width.value_ = -1;
      conv.precision.value_ = -1;
      conv.flags = kBasic;
      conv.length_mod = none;
      conv.conv = v|s;
      conv.conv = ConvTag::as_conv(&tag);
      next_arg = next_arg + 1;
      s._M_str = (char *)p;
      s._M_len = 1;
      conv.arg_position = next_arg;
      bVar3 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne(&consumer_local,&conv,s);
LAB_0014e996:
      if (bVar3 == false) {
        return false;
      }
      __s = (byte *)((long)pvVar2 + 2);
    }
    if (*p == 0x25) {
      s_02._M_str = "%";
      s_02._M_len = 1;
      bVar3 = ParsedFormatBase::ParsedFormatConsumer::Append(&consumer_local,s_02);
      goto LAB_0014e996;
    }
    conv.width.value_ = -1;
    conv.precision.value_ = -1;
    conv.flags = kBasic;
    conv.length_mod = none;
    conv.conv = v|s;
    __s = (byte *)ConsumeUnboundConversionNoInline((char *)p,(char *)end,&conv,&next_arg);
    if (__s == (byte *)0x0) {
      return false;
    }
    s_00._M_len = (long)__s - (long)p;
    s_00._M_str = (char *)p;
    bVar3 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne(&consumer_local,&conv,s_00);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool ParseFormatString(string_view src, Consumer consumer) {
  int next_arg = 0;
  const char* p = src.data();
  const char* const end = p + src.size();
  while (p != end) {
    const char* percent =
        static_cast<const char*>(memchr(p, '%', static_cast<size_t>(end - p)));
    if (!percent) {
      // We found the last substring.
      return consumer.Append(string_view(p, static_cast<size_t>(end - p)));
    }
    // We found a percent, so push the text run then process the percent.
    if (ABSL_PREDICT_FALSE(!consumer.Append(
            string_view(p, static_cast<size_t>(percent - p))))) {
      return false;
    }
    if (ABSL_PREDICT_FALSE(percent + 1 >= end)) return false;

    auto tag = GetTagForChar(percent[1]);
    if (tag.is_conv()) {
      if (ABSL_PREDICT_FALSE(next_arg < 0)) {
        // This indicates an error in the format string.
        // The only way to get `next_arg < 0` here is to have a positional
        // argument first which sets next_arg to -1 and then a non-positional
        // argument.
        return false;
      }
      p = percent + 2;

      // Keep this case separate from the one below.
      // ConvertOne is more efficient when the compiler can see that the `basic`
      // flag is set.
      UnboundConversion conv;
      conv.conv = tag.as_conv();
      conv.arg_position = ++next_arg;
      if (ABSL_PREDICT_FALSE(
              !consumer.ConvertOne(conv, string_view(percent + 1, 1)))) {
        return false;
      }
    } else if (percent[1] != '%') {
      UnboundConversion conv;
      p = ConsumeUnboundConversionNoInline(percent + 1, end, &conv, &next_arg);
      if (ABSL_PREDICT_FALSE(p == nullptr)) return false;
      if (ABSL_PREDICT_FALSE(!consumer.ConvertOne(
              conv, string_view(percent + 1,
                                static_cast<size_t>(p - (percent + 1)))))) {
        return false;
      }
    } else {
      if (ABSL_PREDICT_FALSE(!consumer.Append("%"))) return false;
      p = percent + 2;
      continue;
    }
  }
  return true;
}